

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::to_func_call_arg_abi_cxx11_
          (CompilerHLSL *this,Parameter *arg,uint32_t id)

{
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  undefined1 local_88 [80];
  SPIRType *local_38;
  SPIRType *type;
  char local_25;
  uint32_t local_24;
  char acStack_20 [4];
  uint32_t id_local;
  Parameter *arg_local;
  CompilerHLSL *this_local;
  string *arg_str;
  
  register0x00000014 = in_register_00000014;
  acStack_20 = id;
  local_25 = '\0';
  local_24 = in_ECX;
  arg_local = arg;
  this_local = this;
  CompilerGLSL::to_func_call_arg_abi_cxx11_(&this->super_CompilerGLSL,arg,id);
  if (((0x1e < arg[0x1ee].type.id) &&
      (local_38 = Compiler::expression_type((Compiler *)arg,local_24),
      local_38->basetype == SampledImage)) && ((local_38->image).dim != DimBuffer)) {
    to_sampler_expression_abi_cxx11_((CompilerHLSL *)local_88,(uint32_t)arg);
    ::std::operator+(local_88 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x421228);
    ::std::__cxx11::string::operator+=((string *)this,(string *)(local_88 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_88 + 0x20));
    ::std::__cxx11::string::~string((string *)local_88);
  }
  return this;
}

Assistant:

string CompilerHLSL::to_func_call_arg(const SPIRFunction::Parameter &arg, uint32_t id)
{
	string arg_str = CompilerGLSL::to_func_call_arg(arg, id);

	if (hlsl_options.shader_model <= 30)
		return arg_str;

	// Manufacture automatic sampler arg if the arg is a SampledImage texture and we're in modern HLSL.
	auto &type = expression_type(id);

	// We don't have to consider combined image samplers here via OpSampledImage because
	// those variables cannot be passed as arguments to functions.
	// Only global SampledImage variables may be used as arguments.
	if (type.basetype == SPIRType::SampledImage && type.image.dim != DimBuffer)
		arg_str += ", " + to_sampler_expression(id);

	return arg_str;
}